

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O2

void __thiscall
wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::
allocator<unsigned_int>>&)::Generator::calculateFitness(wasm::CoalesceLocalsWithLearning::
pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order__
          (void *this,Order *order)

{
  uint uVar1;
  double dVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var3
  ;
  Index i;
  ulong uVar4;
  double dVar5;
  undefined1 auStack_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  Index removedCopies;
  
  auStack_38 = (undefined1  [8])0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CoalesceLocals::pickIndicesFromOrder
            (*this,&order->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_38,
             (Index *)((long)&indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  _Var3 = std::
          __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (auStack_38,
                     indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start);
  uVar1 = *(uint *)(*this + 0x288);
  if (*_Var3._M_current <= uVar1) {
    dVar2 = (double)(uVar1 - *_Var3._M_current);
    dVar5 = (double)uVar1;
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      if (uVar4 == (order->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4]) {
        dVar2 = dVar2 + 1.0 / (dVar5 + dVar5);
      }
    }
    order->fitness =
         dVar2 * 100.0 +
         (double)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_38);
    return;
  }
  __assert_fail("maxIndex <= parent->numLocals",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                ,0x282,
                "void wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<Index> &)::Generator::calculateFitness(Order *)"
               );
}

Assistant:

void calculateFitness(Order* order) {
      // apply the order
      std::vector<Index> indices; // the phenotype
      Index removedCopies;
      parent->pickIndicesFromOrder(*order, indices, removedCopies);
      auto maxIndex = *std::max_element(indices.begin(), indices.end());
      assert(maxIndex <= parent->numLocals);
      // main part of fitness is the number of locals
      double fitness = parent->numLocals - maxIndex; // higher fitness is better
      // secondarily, it is nice to not reorder locals unnecessarily
      double fragment = 1.0 / (2.0 * parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        if ((*order)[i] == i) {
          fitness += fragment; // boost for each that wasn't moved
        }
      }
      // removing copies is a secondary concern
      fitness = (100 * fitness) + removedCopies;
      order->setFitness(fitness);
    }